

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-default-aes-impl.c
# Opt level: O3

int ndn_lite_default_aes_cbc_encrypt
              (uint8_t *input_value,uint32_t input_size,uint8_t *output_value,uint32_t *output_size,
              uint8_t *aes_iv,abstract_aes_key *aes_key)

{
  uint uVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  uint inlen;
  uint8_t *puVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  uint8_t *in;
  uint uVar10;
  uint8_t *out;
  uint8_t auStack_110 [8];
  undefined1 local_108 [8];
  tc_aes_key_sched_struct schedule;
  
  iVar5 = -0x1b;
  if (0xf < aes_key->key_size) {
    lVar3 = -((ulong)(input_size + 0x10) + 0xf & 0xfffffffffffffff0);
    in = local_108 + lVar3;
    inlen = input_size & 0xff;
    uVar10 = input_size & 0xf;
    if (uVar10 == 0) {
      puVar9 = auStack_110 + lVar3;
      builtin_memcpy(auStack_110 + lVar3,"&N\x11",4);
      puVar9[4] = '\0';
      puVar9[5] = '\0';
      puVar9[6] = '\0';
      puVar9[7] = '\0';
      memcpy(in,input_value,(ulong)(input_size & 0xf0));
    }
    else {
      uVar1 = (0x10 - uVar10) + inlen;
      if ((input_size + 0x10 & 0xff) < uVar1) {
        return -10;
      }
      puVar7 = auStack_110 + lVar3;
      schedule.words._168_8_ = aes_iv;
      puVar7[0] = 0xdd;
      puVar7[1] = 'M';
      puVar7[2] = '\x11';
      puVar7[3] = '\0';
      puVar7[4] = '\0';
      puVar7[5] = '\0';
      puVar7[6] = '\0';
      puVar7[7] = '\0';
      memcpy(in,input_value,(ulong)inlen);
      bVar2 = "\x01\x02\x03\x04\x05\x06\a\b\t\n\v\f\r\x0e\x0f\x10"[(ulong)uVar10 ^ 0xf];
      puVar8 = auStack_110 + lVar3;
      puVar8[0] = 0xfd;
      puVar8[1] = 'M';
      puVar8[2] = '\x11';
      puVar8[3] = '\0';
      puVar8[4] = '\0';
      puVar8[5] = '\0';
      puVar8[6] = '\0';
      puVar8[7] = '\0';
      memset(in + inlen,(uint)bVar2,(ulong)(0x10 - uVar10));
      aes_iv = (uint8_t *)schedule.words._168_8_;
      inlen = uVar1;
    }
    lVar4 = -(ulong)(inlen + 0x1f & 0xfffffff0);
    out = in + lVar4;
    builtin_memcpy(local_108 + lVar4 + lVar3 + -8,"DN\x11",4);
    out[-4] = '\0';
    out[-3] = '\0';
    out[-2] = '\0';
    out[-1] = '\0';
    iVar6 = tc_aes128_set_encrypt_key((TCAesKeySched_t)local_108,aes_key->key_value);
    iVar5 = -0x1c;
    if (iVar6 == 1) {
      builtin_memcpy(local_108 + lVar4 + lVar3 + -8,"jN\x11",4);
      out[-4] = '\0';
      out[-3] = '\0';
      out[-2] = '\0';
      out[-1] = '\0';
      iVar6 = tc_cbc_mode_encrypt(out,inlen + 0x10,in,inlen,aes_iv,(TCAesKeySched_t)local_108);
      iVar5 = -0x19;
      if (iVar6 == 1) {
        out[-8] = 0x88;
        out[-7] = 'N';
        out[-6] = '\x11';
        out[-5] = '\0';
        out[-4] = '\0';
        out[-3] = '\0';
        out[-2] = '\0';
        out[-1] = '\0';
        memcpy(output_value,out + 0x10,(ulong)inlen);
        *output_size = inlen;
        iVar5 = 0;
      }
    }
  }
  return iVar5;
}

Assistant:

int
ndn_lite_default_aes_cbc_encrypt(const uint8_t* input_value, uint32_t input_size,
                                 uint8_t* output_value, uint32_t* output_size,
                                 const uint8_t* aes_iv, const struct abstract_aes_key* aes_key)
{
  if (aes_key->key_size < NDN_SEC_AES_MIN_KEY_SIZE) {
    return NDN_SEC_WRONG_AES_SIZE;
  }
  // TODO: too much memory usage when encrypt large chunks
  uint8_t final_input[input_size + TC_AES_BLOCK_SIZE];
  int err_or_size = _pkcs7_padding(input_value, input_size, final_input, sizeof(final_input));
  if (err_or_size < 0)
    return err_or_size;
  uint8_t output[err_or_size + TC_AES_BLOCK_SIZE];
  struct tc_aes_key_sched_struct schedule;
  if (tc_aes128_set_encrypt_key(&schedule, aes_key->key_value) != TC_CRYPTO_SUCCESS) {
    return NDN_SEC_INIT_FAILURE;
  }
  // Tinycrypt will prepend IV to the output
  if (tc_cbc_mode_encrypt(output, err_or_size + TC_AES_BLOCK_SIZE,
                          final_input, err_or_size, aes_iv, &schedule) != TC_CRYPTO_SUCCESS) {
    return NDN_SEC_CRYPTO_ALGO_FAILURE;
  }
  memcpy(output_value, output + TC_AES_BLOCK_SIZE, err_or_size);
  *output_size = err_or_size;
  return NDN_SUCCESS;
}